

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O0

void CompoundFile::loadMSATSector
               (istream *stream,
               vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *msat,
               SecID *nextMSATSectorID,int32_t sectorSize)

{
  int in_ECX;
  int32_t *in_RDX;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RSI;
  int32_t nextSecID;
  int32_t secID;
  int32_t i;
  int32_t secIDCount;
  value_type *in_stack_ffffffffffffffb8;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  SecID in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t id;
  SecID in_stack_ffffffffffffffd4;
  int local_24;
  
  for (local_24 = 0; local_24 < (in_ECX + -4) / 4; local_24 = local_24 + 1) {
    readData<int>((istream *)CONCAT44(in_stack_ffffffffffffffd4.m_id,in_stack_ffffffffffffffd0),
                  (int *)CONCAT44(in_stack_ffffffffffffffcc.m_id,in_stack_ffffffffffffffc8),
                  (size_t)in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = in_RSI;
    SecID::SecID((SecID *)&stack0xffffffffffffffd4,0);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  id = 0;
  readData<int>((istream *)((ulong)(uint)in_stack_ffffffffffffffd4.m_id << 0x20),
                (int *)CONCAT44(in_stack_ffffffffffffffcc.m_id,in_stack_ffffffffffffffc8),
                (size_t)in_stack_ffffffffffffffc0);
  SecID::SecID((SecID *)&stack0xffffffffffffffcc,id);
  *in_RDX = in_stack_ffffffffffffffcc.m_id;
  return;
}

Assistant:

inline void
loadMSATSector( std::istream & stream, std::vector< SecID > & msat,
	SecID & nextMSATSectorID, int32_t sectorSize )
{
	const int32_t secIDCount = ( sectorSize - 4 ) / 4;

	for( int32_t i = 0; i < secIDCount; ++i )
	{
		int32_t secID = 0;

		readData( stream, secID, 4 );

		msat.push_back( secID );
	}

	int32_t nextSecID = 0;

	readData( stream, nextSecID, 4 );

	nextMSATSectorID = nextSecID;
}